

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_get_kvs_info(fdb_kvs_handle *handle,fdb_kvs_info *info)

{
  pthread_spinlock_t *__lock;
  ulong uVar1;
  filemgr *file;
  kvs_header *pkVar2;
  avl_node *paVar3;
  char *pcVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  fdb_kvs_id_t kv_id;
  fdb_status fVar7;
  bool bVar8;
  kvs_stat stat;
  kvs_node query;
  kvs_stat local_138;
  fdb_kvs_id_t local_f8;
  avl_node local_48;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar7 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (info == (fdb_kvs_info *)0x0) {
    fVar7 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    LOCK();
    bVar8 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar8) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    fVar7 = FDB_RESULT_HANDLE_BUSY;
    if (bVar8) {
      if (handle->shandle == (snap_handle *)0x0) {
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        fdb_sync_db_header(handle);
      }
      file = handle->file;
      if (handle->kvs == (kvs_info *)0x0) {
        info->name = "default";
        kv_id = 0;
      }
      else {
        pkVar2 = file->kv_header;
        kv_id = handle->kvs->id;
        __lock = &pkVar2->lock;
        pthread_spin_lock(__lock);
        local_f8 = handle->kvs->id;
        paVar3 = avl_search(pkVar2->idx_id,&local_48,_kvs_cmp_id);
        if (paVar3 == (avl_node *)0x0) {
          pcVar4 = "default";
        }
        else {
          pcVar4 = (char *)paVar3[-8].left;
        }
        info->name = pcVar4;
        pthread_spin_unlock(__lock);
      }
      if (handle->shandle == (snap_handle *)0x0) {
        _kvs_stat_get(file,kv_id,&local_138);
      }
      else {
        snap_get_stat(handle->shandle,&local_138);
      }
      uVar1 = (local_138.wal_ndocs - local_138.wal_ndeletes) + local_138.ndocs;
      uVar6 = uVar1 - local_138.wal_ndeletes;
      if (local_138.ndocs == 0) {
        uVar6 = local_138.wal_ndocs - local_138.wal_ndeletes;
      }
      fVar7 = FDB_RESULT_SUCCESS;
      uVar5 = 0;
      if (local_138.wal_ndeletes <= uVar1) {
        uVar5 = uVar6;
      }
      info->doc_count = uVar5;
      info->deleted_count = local_138.wal_ndeletes + local_138.ndeletes;
      info->space_used = (handle->config).blocksize * local_138.nlivenodes + local_138.datasize;
      info->file = handle->fhandle;
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
      fdb_get_kvs_seqnum(handle,&info->last_seqnum);
    }
  }
  return fVar7;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_info(fdb_kvs_handle *handle, fdb_kvs_info *info)
{
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t wal_docs;
    uint64_t wal_deletes;
    uint64_t wal_n_inserts;
    uint64_t datasize;
    uint64_t nlivenodes;
    fdb_kvs_id_t kv_id;
    struct avl_node *a;
    struct filemgr *file;
    struct kvs_node *node, query;
    struct kvs_header *kv_header;
    struct kvs_stat stat;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) { // snapshot handle should be immutable
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    file = handle->file;

    if (handle->kvs == NULL) {
        info->name = default_kvs_name;
        kv_id = 0;

    } else {
        kv_header = file->kv_header;
        kv_id = handle->kvs->id;
        spin_lock(&kv_header->lock);

        query.id = handle->kvs->id;
        a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
        if (a) { // sub handle
            node = _get_entry(a, struct kvs_node, avl_id);
            info->name = (const char*)node->kvs_name;
        } else { // root handle
            info->name = default_kvs_name;
        }
        spin_unlock(&kv_header->lock);
    }

    if (handle->shandle) {
        // snapshot .. get its local stats
        snap_get_stat(handle->shandle, &stat);
    } else {
        _kvs_stat_get(file, kv_id, &stat);
    }
    ndocs = stat.ndocs;
    ndeletes = stat.ndeletes;
    wal_docs = stat.wal_ndocs;
    wal_deletes = stat.wal_ndeletes;
    wal_n_inserts = wal_docs - wal_deletes;

    if (ndocs + wal_n_inserts < wal_deletes) {
        info->doc_count = 0;
    } else {
        if (ndocs) { // not accurate since some ndocs may be in wal_n_inserts
            info->doc_count = ndocs + wal_n_inserts - wal_deletes;
        } else { // this is accurate
            info->doc_count = wal_n_inserts;
        }
    }

    if (ndeletes) { // not accurate since some ndeletes may be wal_n_deletes
        info->deleted_count = ndeletes + wal_deletes;
    } else { // this is accurate
        info->deleted_count = wal_deletes;
    }

    datasize = stat.datasize;
    nlivenodes = stat.nlivenodes;

    info->space_used = datasize;
    info->space_used += nlivenodes * handle->config.blocksize;
    info->file = handle->fhandle;

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);

    // This is another LIBFDB_API call, so handle is marked as free
    // in the line above before making this call
    fdb_get_kvs_seqnum(handle, &info->last_seqnum);

    return FDB_RESULT_SUCCESS;
}